

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateInfoSetCoreTypeFromString
               (HelicsFederateInfo fedInfo,char *coretype,HelicsError *err)

{
  size_type sVar1;
  string_view type;
  CoreType CVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  char *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  HelicsFederateInfo pvVar7;
  bool bVar8;
  string_view newError;
  char *in_stack_ffffffffffffff88;
  size_type *local_70;
  size_type local_60;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  MasterObjectHolder *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (fedInfo == (HelicsFederateInfo)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a084b;
    }
    else {
      bVar8 = *(int *)((long)fedInfo + 0x48) == 0x6bfbbce1;
      pvVar7 = (HelicsFederateInfo)0x0;
      if (bVar8) {
        pvVar7 = fedInfo;
      }
      if (bVar8 || err == (HelicsError *)0x0) goto LAB_001a084e;
    }
    err->error_code = -3;
    err->message = "helics Federate info object was not valid";
  }
LAB_001a084b:
  pvVar7 = (HelicsFederateInfo)0x0;
LAB_001a084e:
  if (pvVar7 != (HelicsFederateInfo)0x0) {
    if (coretype == (char *)0x0) {
      *(undefined4 *)((long)pvVar7 + 0x50) = 0;
    }
    else {
      strlen(coretype);
      type._M_str = in_stack_ffffffffffffff88;
      type._M_len = 0x1a0873;
      CVar2 = helics::core::coreTypeFromString(type);
      if (err == (HelicsError *)0x0 || CVar2 != UNRECOGNIZED) {
        *(CoreType *)((long)pvVar7 + 0x50) = CVar2;
      }
      else {
        err->error_code = -4;
        getMasterHolder();
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar3 = strlen(coretype);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,coretype,coretype + sVar3);
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_50," is not a valid core type");
        local_70 = (size_type *)(pbVar4->_M_dataplus)._M_p;
        paVar6 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70 == paVar6) {
          local_60 = paVar6->_M_allocated_capacity;
          uStack_58 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_70 = &local_60;
        }
        else {
          local_60 = paVar6->_M_allocated_capacity;
        }
        sVar1 = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        newError._M_str = (char *)local_70;
        newError._M_len = sVar1;
        pcVar5 = MasterObjectHolder::addErrorString(local_30,newError);
        err->message = pcVar5;
        if (local_70 != &local_60) {
          operator_delete(local_70,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
        }
      }
    }
  }
  return;
}

Assistant:

void helicsFederateInfoSetCoreTypeFromString(HelicsFederateInfo fedInfo, const char* coretype, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    if (coretype == nullptr) {
        info->coreType = helics::CoreType::DEFAULT;
        return;
    }
    auto ctype = helics::core::coreTypeFromString(coretype);
    if (ctype == helics::CoreType::UNRECOGNIZED) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string(coretype) + " is not a valid core type");
            return;
        }
    }
    info->coreType = ctype;
}